

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerMSL::argument_decl_abi_cxx11_
          (string *__return_storage_ptr__,CompilerMSL *this,Parameter *arg)

{
  BaseType BVar1;
  Dim DVar2;
  StorageClass SVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  uint32_t uVar7;
  SPIRVariable *pSVar8;
  SPIRType *type;
  SPIRType *pSVar9;
  size_type sVar10;
  undefined4 extraout_var;
  char *pcVar11;
  size_type sVar12;
  Bitset *pBVar13;
  SPIRType *pSVar14;
  BuiltIn builtin;
  uint uVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_1;
  char (*ts_1_00) [2];
  string *psVar16;
  string *this_00;
  string *in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  bool bVar17;
  uint32_t local_130;
  string type_name;
  uint32_t array_size;
  undefined4 uStack_fc;
  char *cv_qualifier;
  ulong local_d8;
  undefined8 local_d0;
  SPIRType *local_c8;
  uint local_bc;
  string address_space;
  string local_90;
  char *cv_flags;
  string local_50;
  
  pSVar8 = Compiler::get<spirv_cross::SPIRVariable>((Compiler *)this,(arg->id).id);
  type = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,(arg->type).id);
  local_d8 = (ulong)type->storage;
  pSVar9 = Compiler::get_variable_data_type((Compiler *)this,pSVar8);
  bVar4 = Compiler::is_physical_pointer((Compiler *)this,type);
  pSVar14 = type;
  if (!bVar4) {
    pSVar14 = pSVar9;
  }
  local_130 = (pSVar8->super_IVariant).self.id;
  local_c8 = pSVar9;
  if (arg->alias_global_variable == true) {
    uVar7 = (pSVar8->basevariable).id;
    if (uVar7 != 0) {
      local_130 = uVar7;
    }
LAB_001ed6dc:
    bVar17 = false;
  }
  else {
    if ((bVar4) || (bVar17 = Compiler::is_pointer((Compiler *)this,type), !bVar17))
    goto LAB_001ed6dc;
    bVar17 = arg->write_count == 0;
  }
  BVar1 = pSVar14->basetype;
  DVar2 = (pSVar14->image).dim;
  if ((DVar2 == DimSubpassData && BVar1 == Image) &&
     ((this->msl_options).use_framebuffer_fetch_subpasses != false)) {
    bVar17 = false;
  }
  else {
    bVar17 = (bool)((int)local_d8 == 0 | bVar17);
  }
  local_bc = BVar1 - AccelerationStructure;
  cv_qualifier = "const ";
  if (!bVar17) {
    cv_qualifier = "";
  }
  if (0xfffffffc < local_bc) {
    cv_qualifier = "";
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (((DVar2 == Dim2D & BVar1 == SampledImage & ~arg->alias_global_variable) == 1) &&
     (pSVar9 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,(pSVar14->image).type.id),
     pSVar9->basetype - Half < 3)) {
    address_space._M_dataplus._M_p._0_1_ = 0x44;
    sVar10 = ::std::
             set<spirv_cross::CompilerMSL::SPVFuncImpl,_std::less<spirv_cross::CompilerMSL::SPVFuncImpl>,_std::allocator<spirv_cross::CompilerMSL::SPVFuncImpl>_>
             ::count(&this->spv_function_implementations,(key_type *)&address_space);
    bVar17 = sVar10 != 0;
  }
  else {
    bVar17 = false;
  }
  get_argument_address_space_abi_cxx11_(&address_space,this,pSVar8);
  bVar5 = Compiler::has_decoration
                    ((Compiler *)this,(ID)(pSVar8->super_IVariant).self.id,DecorationBuiltIn);
  uVar7 = Compiler::get_decoration((Compiler *)this,(ID)(arg->id).id,DecorationBuiltIn);
  local_d0 = CONCAT44(extraout_var,uVar7);
  uVar7 = (pSVar8->basevariable).id;
  if ((uVar7 == 0) ||
     ((uVar7 != (this->stage_in_ptr_var_id).id && (uVar7 != (this->stage_out_ptr_var_id).id)))) {
    if ((bVar5) && (bVar6 = is_mesh_shader(this), !bVar6)) {
      pSVar9 = Compiler::get<spirv_cross::SPIRType>
                         ((Compiler *)this,*(uint32_t *)&(pSVar8->super_IVariant).field_0xc);
      SVar3 = pSVar9->storage;
      builtin = (BuiltIn)local_d0;
      if ((builtin - BuiltInTessLevelOuter < 2) && (SVar3 == StorageClassInput)) {
        bVar6 = false;
LAB_001ed94f:
        this->is_using_builtin_array = bVar6;
      }
      else {
        if (builtin - BuiltInVertexId < 0xfffffffe) {
          this->is_using_builtin_array = true;
        }
        if ((SVar3 == StorageClassOutput) && ((this->capture_output_to_buffer & 1U) == 0)) {
          bVar17 = CompilerGLSL::is_stage_output_builtin_masked(&this->super_CompilerGLSL,builtin);
          bVar6 = true;
          if (!bVar17) goto LAB_001ed94f;
        }
      }
      if (this->is_using_builtin_array == true) {
        uVar15 = (arg->id).id;
        ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)uVar15;
        builtin_type_decl_abi_cxx11_((string *)&array_size,this,(BuiltIn)local_d0,uVar15);
        join<char_const*&,std::__cxx11::string>
                  (&type_name,(spirv_cross *)&cv_qualifier,(char **)&array_size,ts_1);
      }
      else {
        ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (ulong)(arg->id).id;
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&array_size,this,pSVar14);
        join<char_const*&,std::__cxx11::string>
                  (&type_name,(spirv_cross *)&cv_qualifier,(char **)&array_size,ts_1);
      }
      goto LAB_001edb49;
    }
    bVar6 = is_var_runtime_size_array(this,pSVar8);
    if (bVar6) {
      pSVar9 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,(pSVar14->parent_type).id);
      in_R8 = (string *)(this->super_CompilerGLSL).super_Compiler._vptr_Compiler;
      (**(code **)((long)&in_R8[4].field_2 + 8))(&type_name,this,pSVar9,(arg->id).id);
      if (pSVar14->basetype == AccelerationStructure) {
        ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x29590a;
        join<char_const(&)[20],std::__cxx11::string&,char_const(&)[2]>
                  ((string *)&array_size,(spirv_cross *)"spvDescriptorArray<",
                   (char (*) [20])&type_name,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x29590a,
                   (char (*) [2])in_R8);
      }
      else if (local_bc < 0xfffffffd) {
        ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x27f106;
        in_R9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x295909;
        in_R8 = &type_name;
        join<char_const(&)[20],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&,char_const(&)[3]>
                  ((string *)&array_size,(spirv_cross *)"spvDescriptorArray<",
                   (char (*) [20])&address_space,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x27f106,
                   (char (*) [2])in_R8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x295909,
                   (char (*) [3])__return_storage_ptr__);
      }
      else {
        in_R8 = (string *)0x29590a;
        ts_1 = &type_name;
        join<char_const(&)[20],char_const*&,std::__cxx11::string&,char_const(&)[2]>
                  ((string *)&array_size,(spirv_cross *)"spvDescriptorArray<",
                   (char (*) [20])&cv_qualifier,(char **)ts_1,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x29590a,
                   (char (*) [2])in_R9);
      }
      ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&array_size);
      ::std::__cxx11::string::~string((string *)&array_size);
      ::std::__cxx11::string::assign((char *)&address_space);
LAB_001edbb8:
      psVar16 = &type_name;
      goto LAB_001edbbd;
    }
    if ((((int)local_d8 == 0xc) || ((int)local_d8 == 2)) &&
       (bVar6 = Compiler::is_array((Compiler *)this,pSVar14), bVar6)) {
      this->is_using_builtin_array = true;
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                (&array_size,this,pSVar14,(ulong)(arg->id).id);
      ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2856d3;
      join<char_const*&,std::__cxx11::string,char_const(&)[2]>
                (&type_name,(spirv_cross *)&cv_qualifier,(char **)&array_size,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2856d3,
                 (char (*) [2])in_R8);
      ::std::__cxx11::string::append((string *)__return_storage_ptr__);
      goto LAB_001edb5d;
    }
    if (bVar17) {
      pSVar9 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,(pSVar14->image).type.id);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&array_size,this,pSVar9,0);
      in_R8 = (string *)0x29590a;
      join<char_const*&,char_const(&)[24],std::__cxx11::string,char_const(&)[2]>
                (&type_name,(spirv_cross *)&cv_qualifier,(char **)"spvDynamicImageSampler<",
                 (char (*) [24])&array_size,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x29590a,
                 (char (*) [2])in_R9);
      ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&type_name);
      ::std::__cxx11::string::~string((string *)&type_name);
      ::std::__cxx11::string::~string((string *)&array_size);
      ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      Compiler::set_extended_decoration
                ((Compiler *)this,(arg->id).id,SPIRVCrossDecorationDynamicImageSampler,0);
    }
    else {
      bVar17 = Compiler::is_pointer((Compiler *)this,local_c8);
      if (!bVar17) {
        ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (ulong)(arg->id).id;
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&array_size,this,pSVar14);
        join<char_const*&,std::__cxx11::string>
                  (&type_name,(spirv_cross *)&cv_qualifier,(char **)&array_size,ts_1);
        ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&type_name);
        goto LAB_001edb5d;
      }
      ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (ulong)(arg->id).id;
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&type_name,this,pSVar14);
      ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&type_name);
      ::std::__cxx11::string::~string((string *)&type_name);
      if (*cv_qualifier != '\0') {
        join<char_const(&)[2],char_const*&>
                  (&type_name,(spirv_cross *)0x27f106,(char (*) [2])&cv_qualifier,(char **)ts_1);
        ::std::__cxx11::string::append((string *)__return_storage_ptr__);
        goto LAB_001edbb8;
      }
    }
  }
  else {
    ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)(arg->id).id;
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&array_size,this,pSVar14);
    join<char_const*&,std::__cxx11::string>
              (&type_name,(spirv_cross *)&cv_qualifier,(char **)&array_size,ts_1);
LAB_001edb49:
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&type_name);
LAB_001edb5d:
    ::std::__cxx11::string::~string((string *)&type_name);
    psVar16 = (string *)&array_size;
LAB_001edbbd:
    ::std::__cxx11::string::~string((string *)psVar16);
  }
  if (bVar4) {
LAB_001edbcd:
    if (((this->msl_options).force_native_arrays == true) &&
       (bVar4 = Compiler::is_array((Compiler *)this,pSVar14), bVar4)) {
      psVar16 = __return_storage_ptr__;
      ::std::__cxx11::string::string((string *)&array_size,"thread const ",(allocator *)&local_90);
      ::std::operator+(&type_name,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &array_size,__return_storage_ptr__);
      ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&type_name);
      ::std::__cxx11::string::~string((string *)&type_name);
      ::std::__cxx11::string::~string((string *)&array_size);
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      pcVar11 = to_restrict(this,local_130,true);
      if (*pcVar11 != '\0') {
        ::std::__cxx11::string::append((char *)psVar16);
        ::std::__cxx11::string::append((char *)psVar16);
      }
      CompilerGLSL::to_expression_abi_cxx11_(&type_name,&this->super_CompilerGLSL,local_130,true);
      ::std::__cxx11::string::append((string *)psVar16);
      ::std::__cxx11::string::~string((string *)&type_name);
      ::std::__cxx11::string::append((char *)psVar16);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x27])
                (&type_name,this,pSVar14,(ulong)local_130);
      ::std::__cxx11::string::append((string *)psVar16);
    }
    else {
      psVar16 = __return_storage_ptr__;
      if (address_space._M_string_length != 0) {
        join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&>
                  (&type_name,(spirv_cross *)&address_space,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x27f106,
                   (char (*) [2])__return_storage_ptr__,in_R8);
        ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&type_name);
        ::std::__cxx11::string::~string((string *)&type_name);
      }
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      CompilerGLSL::to_expression_abi_cxx11_(&type_name,&this->super_CompilerGLSL,local_130,true);
      ::std::__cxx11::string::append((string *)psVar16);
    }
  }
  else {
    if (!bVar5) {
      bVar4 = Compiler::is_pointer((Compiler *)this,type);
      uVar15 = (int)local_d8 - 9;
      ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (ulong)CONCAT31((int3)(uVar15 >> 8),uVar15 < 0xfffffffe);
      if (!bVar4 && uVar15 >= 0xfffffffe) goto LAB_001edbcd;
    }
    bVar4 = Compiler::is_array((Compiler *)this,local_c8);
    ts_1_00 = (char (*) [2])CONCAT71((int7)((ulong)ts_1 >> 8),0xfffffffc < local_bc);
    psVar16 = __return_storage_ptr__;
    if (!bVar4 || 0xfffffffc < local_bc) {
      if ((BVar1 & ~SByte) == Image) {
        bVar4 = is_var_runtime_size_array(this,pSVar8);
        if (bVar4) {
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &cv_flags,&address_space," ");
          ::std::operator+(&local_90,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &cv_flags,psVar16);
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &array_size,&local_90," ");
          CompilerGLSL::to_expression_abi_cxx11_(&local_50,&this->super_CompilerGLSL,local_130,true)
          ;
          ::std::operator+(&type_name,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &array_size,&local_50);
          ::std::__cxx11::string::operator=((string *)psVar16,(string *)&type_name);
          ::std::__cxx11::string::~string((string *)&type_name);
          ::std::__cxx11::string::~string((string *)&local_50);
          ::std::__cxx11::string::~string((string *)&array_size);
          ::std::__cxx11::string::~string((string *)&local_90);
          this_00 = (string *)&cv_flags;
          goto LAB_001edeb1;
        }
        if ((local_c8->array).super_VectorView<unsigned_int>.buffer_size == 0) {
          ::std::__cxx11::string::append((char *)psVar16);
          CompilerGLSL::to_expression_abi_cxx11_
                    (&type_name,&this->super_CompilerGLSL,local_130,true);
          ::std::__cxx11::string::append((string *)psVar16);
        }
        else {
          _array_size = descriptor_address_space
                                  (this,local_130,(StorageClass)local_d8,"thread const");
          join<char_const*&,char_const(&)[2],std::__cxx11::string&>
                    (&type_name,(spirv_cross *)&array_size,(char **)0x27f106,(char (*) [2])psVar16,
                     in_R8);
          ::std::__cxx11::string::operator=((string *)psVar16,(string *)&type_name);
          ::std::__cxx11::string::~string((string *)&type_name);
          ::std::__cxx11::string::append((char *)psVar16);
          CompilerGLSL::to_expression_abi_cxx11_
                    (&type_name,&this->super_CompilerGLSL,local_130,true);
          ::std::__cxx11::string::append((string *)psVar16);
        }
      }
      else {
        type_name._M_dataplus._M_p._0_4_ = (pSVar8->basevariable).id;
        sVar12 = ::std::
                 _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 ::count(&(this->pull_model_inputs)._M_h,(key_type *)&type_name);
        psVar16 = __return_storage_ptr__;
        if ((sVar12 == 0) || (pSVar14->basetype == Struct)) {
          if (address_space._M_string_length != 0) {
            bVar4 = Compiler::is_pointer((Compiler *)this,local_c8);
            if (bVar4) {
              if (*cv_qualifier == '\0') {
                ::std::__cxx11::string::push_back((char)__return_storage_ptr__);
              }
              join<std::__cxx11::string&,char_const(&)[2]>
                        (&type_name,(spirv_cross *)&address_space,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x27f106,ts_1_00);
              psVar16 = __return_storage_ptr__;
              ::std::__cxx11::string::append((string *)__return_storage_ptr__);
            }
            else {
              psVar16 = __return_storage_ptr__;
              join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&>
                        (&type_name,(spirv_cross *)&address_space,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x27f106,(char (*) [2])__return_storage_ptr__,in_R8);
              ::std::__cxx11::string::operator=
                        ((string *)__return_storage_ptr__,(string *)&type_name);
            }
            ::std::__cxx11::string::~string((string *)&type_name);
          }
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          ::std::__cxx11::string::append((char *)psVar16);
          to_restrict(this,local_130,true);
          ::std::__cxx11::string::append((char *)psVar16);
          CompilerGLSL::to_expression_abi_cxx11_
                    (&type_name,&this->super_CompilerGLSL,local_130,true);
          ::std::__cxx11::string::append((string *)psVar16);
        }
        else {
          if (address_space._M_string_length != 0) {
            join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&>
                      (&type_name,(spirv_cross *)&address_space,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x27f106
                       ,(char (*) [2])__return_storage_ptr__,in_R8);
            ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&type_name)
            ;
            ::std::__cxx11::string::~string((string *)&type_name);
          }
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          CompilerGLSL::to_expression_abi_cxx11_
                    (&type_name,&this->super_CompilerGLSL,local_130,true);
          ::std::__cxx11::string::append((string *)psVar16);
        }
      }
    }
    else {
      if (address_space._M_string_length != 0) {
        join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&>
                  (&type_name,(spirv_cross *)&address_space,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x27f106,
                   (char (*) [2])__return_storage_ptr__,in_R8);
        ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&type_name);
        ::std::__cxx11::string::~string((string *)&type_name);
      }
      bVar4 = is_var_runtime_size_array(this,pSVar8);
      if ((!bVar4) &&
         (pcVar11 = descriptor_address_space(this,local_130,(StorageClass)local_d8,(char *)0x0),
         pcVar11 != (char *)0x0)) {
        ::std::__cxx11::string::append((char *)psVar16);
        ::std::__cxx11::string::append((char *)psVar16);
      }
      bVar4 = is_tesc_shader(this);
      if (bVar5 && ((BuiltIn)local_d0 - BuiltInTessLevelOuter < 2 && bVar4)) {
        uVar7 = get_physical_tess_level_array_size(this,(BuiltIn)local_d0);
        array_size = uVar7;
        if (uVar7 == 1) {
          ::std::__cxx11::string::append((char *)psVar16);
          CompilerGLSL::to_expression_abi_cxx11_
                    (&type_name,&this->super_CompilerGLSL,local_130,true);
          ::std::__cxx11::string::append((string *)psVar16);
        }
        else {
          ::std::__cxx11::string::append((char *)psVar16);
          CompilerGLSL::to_expression_abi_cxx11_
                    (&type_name,&this->super_CompilerGLSL,local_130,true);
          ::std::__cxx11::string::append((string *)psVar16);
          ::std::__cxx11::string::~string((string *)&type_name);
          ::std::__cxx11::string::append((char *)psVar16);
          join<char_const(&)[2],unsigned_int&,char_const(&)[2]>
                    (&type_name,(spirv_cross *)0x2828da,(char (*) [2])&array_size,(uint *)0x2827df,
                     (char (*) [2])in_R8);
          ::std::__cxx11::string::append((string *)psVar16);
        }
      }
      else {
        bVar4 = is_var_runtime_size_array(this,pSVar8);
        if (bVar4) {
          CompilerGLSL::to_expression_abi_cxx11_
                    ((string *)&array_size,&this->super_CompilerGLSL,local_130,true);
          ::std::operator+(&type_name," ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &array_size);
          ::std::__cxx11::string::append((string *)psVar16);
          ::std::__cxx11::string::~string((string *)&type_name);
          this_00 = (string *)&array_size;
          goto LAB_001edeb1;
        }
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x27])
                  (&type_name,this,local_c8,(ulong)local_130);
        ::std::__cxx11::string::append((char *)psVar16);
        pcVar11 = to_restrict(this,local_130,true);
        if (*pcVar11 != '\0') {
          ::std::__cxx11::string::append((char *)psVar16);
          ::std::__cxx11::string::append((char *)psVar16);
        }
        CompilerGLSL::to_expression_abi_cxx11_
                  ((string *)&array_size,&this->super_CompilerGLSL,local_130,true);
        ::std::__cxx11::string::append((string *)psVar16);
        ::std::__cxx11::string::~string((string *)&array_size);
        if (type_name._M_string_length != 0) {
          ::std::__cxx11::string::append((char *)psVar16);
          ::std::__cxx11::string::append((string *)psVar16);
        }
      }
    }
  }
  this_00 = &type_name;
LAB_001edeb1:
  ::std::__cxx11::string::~string((string *)this_00);
  pSVar8 = Compiler::maybe_get_backing_variable((Compiler *)this,local_130);
  if (pSVar8 != (SPIRVariable *)0x0) {
    type_name._M_dataplus._M_p._0_4_ = (pSVar8->super_IVariant).self.id;
    sVar12 = ::std::
             _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
             ::count(&(this->atomic_image_vars_emulated)._M_h,(key_type *)&type_name);
    if (sVar12 != 0) {
      pBVar13 = ParsedIR::get_decoration_bitset
                          (&(this->super_CompilerGLSL).super_Compiler.ir,
                           (ID)(pSVar8->super_IVariant).self.id);
      cv_flags = "volatile ";
      if ((pBVar13->lower & 0xa00000) == 0) {
        cv_flags = "";
      }
      pSVar14 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,(type->image).type.id);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&array_size,this,pSVar14,0);
      join<char_const(&)[3],char_const*&,char_const(&)[15],std::__cxx11::string>
                (&type_name,(spirv_cross *)0x294843,(char (*) [3])&cv_flags,
                 (char **)"device atomic_",(char (*) [15])&array_size,in_R9);
      ::std::__cxx11::string::append((string *)psVar16);
      ::std::__cxx11::string::~string((string *)&type_name);
      ::std::__cxx11::string::~string((string *)&array_size);
      CompilerGLSL::to_expression_abi_cxx11_(&local_90,&this->super_CompilerGLSL,local_130,true);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &array_size,"* ",&local_90);
      ::std::operator+(&type_name,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &array_size,"_atomic");
      ::std::__cxx11::string::append((string *)psVar16);
      ::std::__cxx11::string::~string((string *)&type_name);
      ::std::__cxx11::string::~string((string *)&array_size);
      ::std::__cxx11::string::~string((string *)&local_90);
    }
  }
  this->is_using_builtin_array = false;
  ::std::__cxx11::string::~string((string *)&address_space);
  return psVar16;
}

Assistant:

string CompilerMSL::argument_decl(const SPIRFunction::Parameter &arg)
{
	auto &var = get<SPIRVariable>(arg.id);
	auto &var_type = get<SPIRType>(arg.type);
	StorageClass type_storage = var_type.storage;

	// Physical pointer types are passed by pointer, not reference.
	auto &data_type = get_variable_data_type(var);
	bool passed_by_value = is_physical_pointer(var_type);
	auto &type = passed_by_value ? var_type : data_type;

	// If we need to modify the name of the variable, make sure we use the original variable.
	// Our alias is just a shadow variable.
	uint32_t name_id = var.self;
	if (arg.alias_global_variable && var.basevariable)
		name_id = var.basevariable;

	bool constref = !arg.alias_global_variable && !passed_by_value && is_pointer(var_type) && arg.write_count == 0;
	// Framebuffer fetch is plain value, const looks out of place, but it is not wrong.
	if (type_is_msl_framebuffer_fetch(type))
		constref = false;
	else if (type_storage == StorageClassUniformConstant)
		constref = true;

	bool type_is_image = type.basetype == SPIRType::Image || type.basetype == SPIRType::SampledImage ||
	                     type.basetype == SPIRType::Sampler;
	bool type_is_tlas = type.basetype == SPIRType::AccelerationStructure;

	// For opaque types we handle const later due to descriptor address spaces.
	const char *cv_qualifier = (constref && !type_is_image) ? "const " : "";
	string decl;

	// If this is a combined image-sampler for a 2D image with floating-point type,
	// we emitted the 'spvDynamicImageSampler' type, and this is *not* an alias parameter
	// for a global, then we need to emit a "dynamic" combined image-sampler.
	// Unfortunately, this is necessary to properly support passing around
	// combined image-samplers with Y'CbCr conversions on them.
	bool is_dynamic_img_sampler = !arg.alias_global_variable && type.basetype == SPIRType::SampledImage &&
	                              type.image.dim == Dim2D && type_is_floating_point(get<SPIRType>(type.image.type)) &&
	                              spv_function_implementations.count(SPVFuncImplDynamicImageSampler);

	// Allow Metal to use the array<T> template to make arrays a value type
	string address_space = get_argument_address_space(var);
	bool builtin = has_decoration(var.self, DecorationBuiltIn);
	auto builtin_type = BuiltIn(get_decoration(arg.id, DecorationBuiltIn));

	if (var.basevariable && (var.basevariable == stage_in_ptr_var_id || var.basevariable == stage_out_ptr_var_id))
		decl = join(cv_qualifier, type_to_glsl(type, arg.id));
	else if (builtin && !is_mesh_shader())
	{
		// Only use templated array for Clip/Cull distance when feasible.
		// In other scenarios, we need need to override array length for tess levels (if used as outputs),
		// or we need to emit the expected type for builtins (uint vs int).
		auto storage = get<SPIRType>(var.basetype).storage;

		if (storage == StorageClassInput &&
		    (builtin_type == BuiltInTessLevelInner || builtin_type == BuiltInTessLevelOuter))
		{
			is_using_builtin_array = false;
		}
		else if (builtin_type != BuiltInClipDistance && builtin_type != BuiltInCullDistance)
		{
			is_using_builtin_array = true;
		}

		if (storage == StorageClassOutput && variable_storage_requires_stage_io(storage) &&
		    !is_stage_output_builtin_masked(builtin_type))
			is_using_builtin_array = true;

		if (is_using_builtin_array)
			decl = join(cv_qualifier, builtin_type_decl(builtin_type, arg.id));
		else
			decl = join(cv_qualifier, type_to_glsl(type, arg.id));
	}
	else if (is_var_runtime_size_array(var))
	{
		const auto *parent_type = &get<SPIRType>(type.parent_type);
		auto type_name = type_to_glsl(*parent_type, arg.id);
		if (type.basetype == SPIRType::AccelerationStructure)
			decl = join("spvDescriptorArray<", type_name, ">");
		else if (type_is_image)
			decl = join("spvDescriptorArray<", cv_qualifier, type_name, ">");
		else
			decl = join("spvDescriptorArray<", address_space, " ", type_name, "*>");
		address_space = "const";
	}
	else if ((type_storage == StorageClassUniform || type_storage == StorageClassStorageBuffer) && is_array(type))
	{
		is_using_builtin_array = true;
		decl += join(cv_qualifier, type_to_glsl(type, arg.id), "*");
	}
	else if (is_dynamic_img_sampler)
	{
		decl = join(cv_qualifier, "spvDynamicImageSampler<", type_to_glsl(get<SPIRType>(type.image.type)), ">");
		// Mark the variable so that we can handle passing it to another function.
		set_extended_decoration(arg.id, SPIRVCrossDecorationDynamicImageSampler);
	}
	else
	{
		// The type is a pointer type we need to emit cv_qualifier late.
		if (is_pointer(data_type))
		{
			decl = type_to_glsl(type, arg.id);
			if (*cv_qualifier != '\0')
				decl += join(" ", cv_qualifier);
		}
		else
		{
			decl = join(cv_qualifier, type_to_glsl(type, arg.id));
		}
	}

	if (passed_by_value || (!builtin && !is_pointer(var_type) &&
	                        (type_storage == StorageClassFunction || type_storage == StorageClassGeneric)))
	{
		// If the argument is a pure value and not an opaque type, we will pass by value.
		if (msl_options.force_native_arrays && is_array(type))
		{
			// We are receiving an array by value. This is problematic.
			// We cannot be sure of the target address space since we are supposed to receive a copy,
			// but this is not possible with MSL without some extra work.
			// We will have to assume we're getting a reference in thread address space.
			// If we happen to get a reference in constant address space, the caller must emit a copy and pass that.
			// Thread const therefore becomes the only logical choice, since we cannot "create" a constant array from
			// non-constant arrays, but we can create thread const from constant.
			decl = string("thread const ") + decl;
			decl += " (&";
			const char *restrict_kw = to_restrict(name_id, true);
			if (*restrict_kw)
			{
				decl += " ";
				decl += restrict_kw;
			}
			decl += to_expression(name_id);
			decl += ")";
			decl += type_to_array_glsl(type, name_id);
		}
		else
		{
			if (!address_space.empty())
				decl = join(address_space, " ", decl);
			decl += " ";
			decl += to_expression(name_id);
		}
	}
	else if (is_array(type) && !type_is_image)
	{
		// Arrays of opaque types are special cased.
		if (!address_space.empty())
			decl = join(address_space, " ", decl);

		// spvDescriptorArray absorbs the address space inside the template.
		if (!is_var_runtime_size_array(var))
		{
			const char *argument_buffer_space = descriptor_address_space(name_id, type_storage, nullptr);
			if (argument_buffer_space)
			{
				decl += " ";
				decl += argument_buffer_space;
			}
		}

		// Special case, need to override the array size here if we're using tess level as an argument.
		if (is_tesc_shader() && builtin &&
		    (builtin_type == BuiltInTessLevelInner || builtin_type == BuiltInTessLevelOuter))
		{
			uint32_t array_size = get_physical_tess_level_array_size(builtin_type);
			if (array_size == 1)
			{
				decl += " &";
				decl += to_expression(name_id);
			}
			else
			{
				decl += " (&";
				decl += to_expression(name_id);
				decl += ")";
				decl += join("[", array_size, "]");
			}
		}
		else if (is_var_runtime_size_array(var))
		{
			decl += " " + to_expression(name_id);
		}
		else
		{
			auto array_size_decl = type_to_array_glsl(type, name_id);
			if (array_size_decl.empty())
				decl += "& ";
			else
				decl += " (&";

			const char *restrict_kw = to_restrict(name_id, true);
			if (*restrict_kw)
			{
				decl += " ";
				decl += restrict_kw;
			}
			decl += to_expression(name_id);

			if (!array_size_decl.empty())
			{
				decl += ")";
				decl += array_size_decl;
			}
		}
	}
	else if (!type_is_image && !type_is_tlas &&
	         (!pull_model_inputs.count(var.basevariable) || type.basetype == SPIRType::Struct))
	{
		// If this is going to be a reference to a variable pointer, the address space
		// for the reference has to go before the '&', but after the '*'.
		if (!address_space.empty())
		{
			if (is_pointer(data_type))
			{
				if (*cv_qualifier == '\0')
					decl += ' ';
				decl += join(address_space, " ");
			}
			else
				decl = join(address_space, " ", decl);
		}

		decl += "&";
		decl += " ";
		decl += to_restrict(name_id, true);
		decl += to_expression(name_id);
	}
	else if (type_is_image || type_is_tlas)
	{
		if (is_var_runtime_size_array(var))
		{
			decl = address_space + " " + decl + " " + to_expression(name_id);
		}
		else if (type.array.empty())
		{
			// For non-arrayed types we can just pass opaque descriptors by value.
			// This fixes problems if descriptors are passed by value from argument buffers and plain descriptors
			// in same shader.
			// There is no address space we can actually use, but value will work.
			// This will break if applications attempt to pass down descriptor arrays as arguments, but
			// fortunately that is extremely unlikely ...
			decl += " ";
			decl += to_expression(name_id);
		}
		else
		{
			const char *img_address_space = descriptor_address_space(name_id, type_storage, "thread const");
			decl = join(img_address_space, " ", decl);
			decl += "& ";
			decl += to_expression(name_id);
		}
	}
	else
	{
		if (!address_space.empty())
			decl = join(address_space, " ", decl);
		decl += " ";
		decl += to_expression(name_id);
	}

	// Emulate texture2D atomic operations
	auto *backing_var = maybe_get_backing_variable(name_id);
	if (backing_var && atomic_image_vars_emulated.count(backing_var->self))
	{
		auto &flags = ir.get_decoration_bitset(backing_var->self);
		const char *cv_flags = decoration_flags_signal_volatile(flags) ? "volatile " : "";
		decl += join(", ", cv_flags, "device atomic_", type_to_glsl(get<SPIRType>(var_type.image.type), 0));
		decl += "* " + to_expression(name_id) + "_atomic";
	}

	is_using_builtin_array = false;

	return decl;
}